

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O0

int parse_cmd_line(int argc,char **argv,nvamemtiming_conf *conf)

{
  int iVar1;
  int *in_RDX;
  char **in_RSI;
  int in_EDI;
  int val;
  int c;
  char **in_stack_ffffffffffffffd8;
  int local_20;
  int local_4;
  
  *in_RDX = 0;
  in_RDX[1] = 0;
  in_RDX[3] = 0;
  in_RDX[6] = 0;
  in_RDX[7] = 0;
  *(undefined1 *)(in_RDX + 4) = 0xff;
  *(undefined1 *)((long)in_RDX + 0x11) = 0xff;
  while (iVar1 = getopt(in_EDI,in_RSI,"hts:f:d:b:c:e:v:"), iVar1 != -1) {
    in_stack_ffffffffffffffd8 = (char **)(ulong)(iVar1 - 0x62);
    switch(in_stack_ffffffffffffffd8) {
    case (char **)0x0:
      if (in_RDX[3] != 0) {
        usage(iVar1,in_stack_ffffffffffffffd8);
      }
      in_RDX[3] = 1;
      __isoc99_sscanf(_optarg,"%d",&local_20);
      *(char *)(in_RDX + 4) = (char)local_20;
      break;
    case (char **)0x1:
      __isoc99_sscanf(_optarg,"%d",&local_20);
      *in_RDX = local_20;
      break;
    case (char **)0x2:
      if (in_RDX[3] != 0) {
        usage(iVar1,in_stack_ffffffffffffffd8);
      }
      in_RDX[3] = 3;
      __isoc99_sscanf(_optarg,"%d",&local_20);
      *(char *)(in_RDX + 4) = (char)local_20;
      break;
    case (char **)0x3:
      if ((in_RDX[3] != 0) && (in_RDX[3] != 2)) {
        usage(iVar1,in_stack_ffffffffffffffd8);
      }
      in_RDX[3] = 2;
      __isoc99_sscanf(_optarg,"%d",&local_20);
      *(char *)(in_RDX + 4) = (char)local_20;
      break;
    case (char **)0x4:
      if (in_RDX[3] != 0) {
        usage(iVar1,in_stack_ffffffffffffffd8);
      }
      __isoc99_sscanf(_optarg,"%d",&local_20);
      *(char *)((long)in_RDX + 0x11) = (char)local_20;
      break;
    case (char **)0x6:
      usage(iVar1,in_stack_ffffffffffffffd8);
      break;
    case (char **)0x11:
      if (in_RDX[3] != 0) {
        usage(iVar1,in_stack_ffffffffffffffd8);
      }
      __isoc99_sscanf(_optarg,"%d",&local_20);
      *(char *)(in_RDX + 4) = (char)local_20;
      break;
    case (char **)0x12:
      in_RDX[1] = 1;
      break;
    case (char **)0x14:
      if ((in_RDX[3] != 0) && (in_RDX[3] != 2)) {
        usage(iVar1,in_stack_ffffffffffffffd8);
      }
      in_RDX[3] = 2;
      __isoc99_sscanf(_optarg,"%d",&local_20);
      *(char *)((long)in_RDX + 0x11) = (char)local_20;
    }
  }
  if (*in_RDX < nva_cardsnum) {
    if (in_EDI != _optind + 4) {
      usage(-1,in_stack_ffffffffffffffd8);
    }
    *(char **)(in_RDX + 6) = in_RSI[_optind];
    __isoc99_sscanf(in_RSI[_optind + 1],"%hx",(long)in_RDX + 0x2a);
    iVar1 = atoi(in_RSI[_optind + 2]);
    *(char *)(in_RDX + 0xc) = (char)iVar1;
    iVar1 = atoi(in_RSI[_optind + 3]);
    *(char *)((long)in_RDX + 0x31) = (char)iVar1;
    local_4 = 0;
  }
  else {
    if (nva_cardsnum == 0) {
      fprintf(_stderr,"No cards found.\n");
    }
    else {
      fprintf(_stderr,"No such card.\n");
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int parse_cmd_line(int argc, char **argv, struct nvamemtiming_conf *conf)
{
	int c, val;

	conf->cnum = 0;
	conf->mmiotrace = false;
	conf->mode = MODE_AUTO;
	conf->vbios.file = NULL;
	conf->range.start = -1;
	conf->range.end = -1;

	while ((c = getopt (argc, argv, "hts:f:d:b:c:e:v:")) != -1)
		switch (c) {
			case 'e':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.index = val;
				break;
			case 'v':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.value = val;
				break;
			case 'd':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_DEEP;
				sscanf(optarg, "%d", &val);
				conf->deep.entry = val;
				break;
			case 'b':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_BITFIELD;
				sscanf(optarg, "%d", &val);
				conf->bitfield.index = val;
				break;
			case 's':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.start = val;
				break;
			case 'f':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.end = val;
				break;
			case 'c':
				sscanf(optarg, "%d", &val);
				conf->cnum = val;
				break;
			case 't':
				conf->mmiotrace = true;
				break;
			case 'h':
				usage(argc, argv);
		}
	if (conf->cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (argc != optind + 4)
		usage(argc, argv);

	conf->vbios.file = argv[optind];
	sscanf(argv[optind + 1], "%hx", &conf->vbios.timing_table_offset);
	conf->timing.entry = atoi(argv[optind + 2]);
	conf->timing.perflvl = atoi(argv[optind + 3]);

	return 0;
}